

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticLine>::Write
          (TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *this,TPZStream *buf,int withclassid)

{
  long lVar1;
  
  TPZGeoEl::Write(&this->super_TPZGeoEl,buf,withclassid);
  pztopology::TPZLine::Write((TPZLine *)&this->fGeo,buf,withclassid);
  (*buf->_vptr_TPZStream[5])
            (buf,(this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.fNodeIndexes,3);
  lVar1 = 0;
  do {
    (**(code **)(*(long *)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) +
                0x28))((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1,buf,
                       withclassid);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x48);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Write(TPZStream &buf, int withclassid) const {
    TPZGeoEl::Write(buf, withclassid);
    fGeo.Write(buf, withclassid);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Write(buf, withclassid);
    }
}